

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicInputCase8::Run(BasicInputCase8 *this)

{
  long lVar1;
  Vector<float,_4> local_108;
  Vector<float,_4> local_f8;
  Vector<float,_4> local_e8;
  Vector<float,_4> local_d8;
  Vector<float,_4> local_c8;
  Vector<float,_4> local_b8;
  Vector<float,_4> local_a8;
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  Vector<float,_4> local_78;
  undefined1 local_68 [8];
  GLfloat d_1 [10];
  undefined8 local_38;
  GLfloat d [6];
  uint local_14;
  GLuint i;
  BasicInputCase8 *this_local;
  
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    glu::CallLogWrapper::glVertexAttrib4f
              (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
                super_GLWrapper.super_CallLogWrapper,local_14,0.0,0.0,0.0,0.0);
  }
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,this->m_vbo[0]);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x18,(void *)0x0,0x88e4);
  local_38 = 0x400000003f800000;
  d[0] = 3.0;
  d[1] = 4.0;
  d[2] = 5.0;
  d[3] = 6.0;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0,0x18,&local_38);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,this->m_vbo[1]);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x28,(void *)0x0,0x88e4);
  memcpy(local_68,&DAT_02a47ce0,0x28);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0,0x28,local_68);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,3,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,1,3,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2,1,0x1406,'\0',4);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,5,4,0x1406,'\0',0xc);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0xe,2,0x1406,'\0',8);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,0);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,1,1);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2,1);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,5,0xf);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0xe,7);
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,this->m_vbo[0],0,0xc);
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,1,this->m_vbo[0],4,4);
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,7,this->m_vbo[1],8,0x10);
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0xf,this->m_vbo[1],0xc,0);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,1);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,5);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0xe);
  tcu::Vector<float,_4>::Vector(&local_78,1.0,2.0,3.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0].m_data = local_78.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0].m_data + 2) = local_78.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_88,2.0,3.0,4.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[1].m_data = local_88.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[1].m_data + 2) = local_88.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_98,3.0,0.0,0.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[2].m_data = local_98.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[2].m_data + 2) = local_98.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_a8,-7.0,-8.0,-9.0,-10.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[5].m_data = local_a8.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[5].m_data + 2) = local_a8.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_b8,-5.0,-6.0,0.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0xe].m_data = local_b8.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0xe].m_data + 2) =
       local_b8.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_c8,4.0,5.0,6.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x10].m_data = local_c8.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x10].m_data + 2) =
       local_c8.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_d8,3.0,4.0,5.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x11].m_data = local_d8.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x11].m_data + 2) =
       local_d8.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_e8,4.0,0.0,0.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x12].m_data = local_e8.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x12].m_data + 2) =
       local_e8.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_f8,-7.0,-8.0,-9.0,-10.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x15].m_data = local_f8.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x15].m_data + 2) =
       local_f8.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_108,-9.0,-10.0,0.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x1e].m_data = local_108.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x1e].m_data + 2) =
       local_108.m_data._8_8_;
  lVar1 = BasicInputBase::Run(&this->super_BasicInputBase);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 16; ++i)
		{
			glVertexAttrib4f(i, 0.0f, 0.0f, 0.0f, 0.0f);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[0]);
		glBufferData(GL_ARRAY_BUFFER, 6 * 4, NULL, GL_STATIC_DRAW);
		{
			GLfloat d[] = { 1.0f, 2.0f, 3.0f, 4.0f, 5.0f, 6.0f };
			glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(d), d);
		}

		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[1]);
		glBufferData(GL_ARRAY_BUFFER, 10 * 4, NULL, GL_STATIC_DRAW);
		{
			GLfloat d[] = { -1.0f, -2.0f, -3.0f, -4.0f, -5.0f, -6.0f, -7.0f, -8.0f, -9.0f, -10.0f };
			glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(d), d);
		}
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);
		glVertexAttribFormat(0, 3, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(1, 3, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(2, 1, GL_FLOAT, GL_FALSE, 4);
		glVertexAttribFormat(5, 4, GL_FLOAT, GL_FALSE, 12);
		glVertexAttribFormat(14, 2, GL_FLOAT, GL_FALSE, 8);
		glVertexAttribBinding(0, 0);
		glVertexAttribBinding(1, 1);
		glVertexAttribBinding(2, 1);
		glVertexAttribBinding(5, 15);
		glVertexAttribBinding(14, 7);
		glBindVertexBuffer(0, m_vbo[0], 0, 12);
		glBindVertexBuffer(1, m_vbo[0], 4, 4);
		glBindVertexBuffer(7, m_vbo[1], 8, 16);
		glBindVertexBuffer(15, m_vbo[1], 12, 0);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glEnableVertexAttribArray(2);
		glEnableVertexAttribArray(5);
		glEnableVertexAttribArray(14);

		expected_data[0]	   = Vec4(1.0f, 2.0f, 3.0f, 1.0f);
		expected_data[1]	   = Vec4(2.0f, 3.0f, 4.0f, 1.0f);
		expected_data[2]	   = Vec4(3.0f, 0.0f, 0.0f, 1.0f);
		expected_data[5]	   = Vec4(-7.0f, -8.0f, -9.0f, -10.0f);
		expected_data[14]	  = Vec4(-5.0f, -6.0f, 0.0f, 1.0f);
		expected_data[0 + 16]  = Vec4(4.0f, 5.0f, 6.0f, 1.0f);
		expected_data[1 + 16]  = Vec4(3.0f, 4.0f, 5.0f, 1.0f);
		expected_data[2 + 16]  = Vec4(4.0f, 0.0f, 0.0f, 1.0f);
		expected_data[5 + 16]  = Vec4(-7.0f, -8.0f, -9.0f, -10.0f);
		expected_data[14 + 16] = Vec4(-9.0f, -10.0f, 0.0f, 1.0f);
		return BasicInputBase::Run();
	}